

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::lastIndexOf
                    (QStringView haystack,qsizetype from,QLatin1StringView needle,CaseSensitivity cs
                    )

{
  byte bVar1;
  char16_t *pcVar2;
  char32_t cVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  QChar *pQVar7;
  QChar *start;
  long lVar8;
  QChar *pQVar9;
  ulong uVar10;
  byte *pbVar11;
  ushort uVar12;
  byte *b;
  short sVar13;
  ushort uVar14;
  long lVar15;
  ulong uVar16;
  size_t l;
  ulong uVar17;
  QChar *pQVar18;
  
  b = (byte *)needle.m_data;
  lVar6 = needle.m_size;
  start = (QChar *)haystack.m_data;
  uVar10 = haystack.m_size;
  if (lVar6 == 1) {
    if (uVar10 != 0) {
      bVar1 = *b;
      uVar12 = (ushort)bVar1;
      if (from < 0) {
        lVar6 = from + uVar10;
        if ((long)(from + uVar10) < 0) {
          return -1;
        }
      }
      else {
        lVar6 = from;
        if (uVar10 < (ulong)from) {
          lVar6 = uVar10 - 1;
        }
      }
      if (cs == CaseSensitive) {
        if (-1 < lVar6) {
          lVar6 = lVar6 * 2;
          do {
            if (*(ushort *)((long)&start->ucs + lVar6) == (ushort)bVar1) {
LAB_0032842c:
              return lVar6 >> 1;
            }
            pQVar18 = (QChar *)((long)&start[-1].ucs + lVar6);
            lVar6 = lVar6 + -2;
          } while (start <= pQVar18);
        }
      }
      else {
        sVar13 = (short)((uint)(int)(short)*(ushort *)
                                            (QUnicodeTables::uc_properties +
                                            (ulong)*(ushort *)
                                                    (QUnicodeTables::uc_property_trie +
                                                    (ulong)((bVar1 & 0x1f) +
                                                           (uint)*(ushort *)
                                                                  (QUnicodeTables::uc_property_trie
                                                                  + (ulong)(bVar1 >> 5) * 2)) * 2) *
                                            0x14 + 0xe) >> 1);
        if ((*(ushort *)
              (QUnicodeTables::uc_properties +
              (ulong)*(ushort *)
                      (QUnicodeTables::uc_property_trie +
                      (ulong)((bVar1 & 0x1f) +
                             (uint)*(ushort *)
                                    (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) *
                      2) * 0x14 + 0xe) & 1) == 0) {
          uVar12 = sVar13 + (ushort)bVar1;
        }
        else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar13 * 2) == 1) {
          uVar12 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar13 * 2 + 2);
        }
        if (-1 < lVar6) {
          lVar6 = lVar6 * 2;
          do {
            uVar14 = *(ushort *)((long)&start->ucs + lVar6);
            sVar13 = (short)((uint)(int)(short)*(ushort *)
                                                (QUnicodeTables::uc_properties +
                                                (ulong)*(ushort *)
                                                        (QUnicodeTables::uc_property_trie +
                                                        (ulong)((uVar14 & 0x1f) +
                                                               (uint)*(ushort *)
                                                                      (QUnicodeTables::
                                                                       uc_property_trie +
                                                                      (ulong)(uVar14 >> 5) * 2)) * 2
                                                        ) * 0x14 + 0xe) >> 1);
            if ((*(ushort *)
                  (QUnicodeTables::uc_properties +
                  (ulong)*(ushort *)
                          (QUnicodeTables::uc_property_trie +
                          (ulong)((uVar14 & 0x1f) +
                                 (uint)*(ushort *)
                                        (QUnicodeTables::uc_property_trie + (ulong)(uVar14 >> 5) * 2
                                        )) * 2) * 0x14 + 0xe) & 1) == 0) {
              uVar14 = sVar13 + uVar14;
            }
            else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar13 * 2) == 1) {
              uVar14 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar13 * 2 + 2);
            }
            if (uVar14 == uVar12) goto LAB_0032842c;
            pQVar18 = (QChar *)((long)&start[-1].ucs + lVar6);
            lVar6 = lVar6 + -2;
          } while (start <= pQVar18);
        }
      }
    }
  }
  else {
    uVar16 = (from >> 0x3f & uVar10) + from;
    if (uVar16 == uVar10 && lVar6 == 0) {
      return uVar10;
    }
    uVar17 = uVar10 - lVar6;
    if (-1 < (long)uVar17 && uVar16 <= uVar10) {
      if ((long)uVar16 < (long)uVar17) {
        uVar17 = uVar16;
      }
      pQVar18 = start + uVar17;
      uVar10 = 0;
      if (lVar6 != 0) {
        uVar10 = lVar6 - 1;
      }
      if (cs == CaseSensitive) {
        if (lVar6 < 1) {
          lVar15 = 0;
          lVar5 = 0;
        }
        else {
          lVar5 = 0;
          lVar15 = 0;
          lVar8 = lVar6;
          do {
            lVar5 = (ulong)b[lVar8 - (ulong)(lVar6 != 0)] + lVar5 * 2;
            lVar15 = (ulong)*(ushort *)
                             ((long)start +
                             lVar8 * 2 + (uVar17 * 2 - (ulong)((uint)(lVar6 != 0) * 2))) +
                     lVar15 * 2;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        if (-1 < (long)uVar16) {
          lVar15 = lVar15 - (ulong)(ushort)pQVar18->ucs;
          do {
            lVar15 = (ulong)(ushort)pQVar18->ucs + lVar15;
            if (lVar15 == lVar5) {
              pQVar7 = pQVar18;
              pbVar11 = b;
              do {
                if (pQVar18 + lVar6 <= pQVar7) {
                  return (long)pQVar18 - (long)start >> 1;
                }
                bVar1 = *pbVar11;
                pbVar11 = pbVar11 + 1;
                pcVar2 = &pQVar7->ucs;
                pQVar7 = pQVar7 + 1;
              } while (*pcVar2 == (ushort)bVar1);
            }
            pQVar18 = pQVar18 + -1;
            if (uVar10 < 0x40) {
              lVar15 = lVar15 - ((ulong)(ushort)pQVar18[lVar6].ucs << ((byte)uVar10 & 0x3f));
            }
            lVar15 = lVar15 * 2;
          } while (start <= pQVar18);
        }
      }
      else {
        if (lVar6 < 1) {
          lVar15 = 0;
          lVar5 = 0;
        }
        else {
          pQVar7 = pQVar18 + uVar10;
          lVar5 = 0;
          lVar15 = 0;
          pQVar9 = start;
          lVar8 = lVar6;
          do {
            cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(ulong)b[lVar8 - (ulong)(lVar6 != 0)],(char *)pQVar9);
            lVar5 = (ulong)(uint)cVar3 + lVar5 * 2;
            pQVar9 = start;
            cVar3 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar7,start);
            lVar15 = (ulong)(uint)cVar3 + lVar15 * 2;
            pQVar7 = pQVar7 + -1;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        if (-1 < (long)uVar16) {
          cVar3 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar18,start);
          lVar15 = lVar15 - (ulong)(uint)cVar3;
          lVar8 = uVar17 * 2;
          do {
            pQVar18 = (QChar *)((long)&start->ucs + lVar8);
            cVar3 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar18,start);
            lVar15 = (ulong)(uint)cVar3 + lVar15;
            if ((lVar15 == lVar5) &&
               (iVar4 = ucstricmp(lVar6,(char16_t *)pQVar18,lVar6,(char *)b), iVar4 == 0)) {
              return lVar8 >> 1;
            }
            if (uVar10 < 0x40) {
              cVar3 = (anonymous_namespace)::foldCaseHelper<QChar_const*>
                                ((QChar *)((long)&start[lVar6 + -1].ucs + lVar8),start);
              lVar15 = lVar15 - ((ulong)(uint)cVar3 << ((byte)uVar10 & 0x3f));
            }
            lVar15 = lVar15 * 2;
            pQVar18 = (QChar *)((long)&start[-1].ucs + lVar8);
            lVar8 = lVar8 + -2;
          } while (start <= pQVar18);
        }
      }
    }
  }
  return -1;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QStringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}